

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::display<unsigned_char>(CImgDisplay *this,CImg<unsigned_char> *img)

{
  bool bVar1;
  uchar *puVar2;
  CImgArgumentException *this_00;
  CImgDisplay *this_01;
  undefined4 uVar3;
  char *local_60;
  char local_39;
  CImg<unsigned_char> *img_local;
  CImgDisplay *this_local;
  
  puVar2 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)img);
  if (puVar2 == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    local_39 = '\"';
    if (this->_title == (char *)0x0) {
      local_39 = '[';
    }
    if (this->_title == (char *)0x0) {
      local_60 = "untitled";
    }
    else {
      local_60 = this->_title;
    }
    uVar3 = 0x5d;
    if (this->_title != (char *)0x0) {
      uVar3 = 0x22;
    }
    CImgArgumentException::CImgArgumentException
              (this_00,"[instance(%u,%u,%u,%c%s%c)] CImgDisplay::display(): Empty specified image.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_normalization,
               (ulong)(uint)(int)local_39,local_60,uVar3);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar1 = is_empty(this);
  if (bVar1) {
    this_local = assign<unsigned_char>(this,img,(char *)0x0,3,false,false);
  }
  else {
    this_01 = render<unsigned_char>(this,img,false);
    this_local = paint(this_01,false);
  }
  return this_local;
}

Assistant:

CImgDisplay& display(const CImg<T>& img) {
      if (!img)
        throw CImgArgumentException(_cimgdisplay_instance
                                    "display(): Empty specified image.",
                                    cimgdisplay_instance);
      if (is_empty()) return assign(img);
      return render(img).paint(false);
    }